

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

void __thiscall
llvm::cl::generic_parser_base::printGenericOptionDiff
          (generic_parser_base *this,Option *O,GenericOptionValue *Value,GenericOptionValue *Default
          ,size_t GlobalWidth)

{
  uint uVar1;
  int iVar2;
  raw_ostream *prVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  size_t sVar4;
  size_t extraout_RDX;
  ulong extraout_RDX_00;
  size_t extraout_RDX_01;
  char *pcVar5;
  uint uVar6;
  uint j;
  ulong uVar7;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  StringRef Str_02;
  StringRef Str_03;
  StringRef Str_04;
  
  prVar3 = outs();
  Str.Length = 3;
  Str.Data = "  -";
  prVar3 = raw_ostream::operator<<(prVar3,Str);
  raw_ostream::operator<<(prVar3,O->ArgStr);
  prVar3 = outs();
  raw_ostream::indent(prVar3,(int)GlobalWidth - (int)(O->ArgStr).Length);
  uVar1 = (*this->_vptr_generic_parser_base[2])(this);
  if (uVar1 != 0) {
    uVar6 = 0;
    do {
      iVar2 = (*this->_vptr_generic_parser_base[6])(this,(ulong)uVar6);
      iVar2 = (**Value->_vptr_GenericOptionValue)(Value,CONCAT44(extraout_var,iVar2));
      if ((char)iVar2 == '\0') {
        prVar3 = outs();
        Str_00.Length = 2;
        Str_00.Data = "= ";
        prVar3 = raw_ostream::operator<<(prVar3,Str_00);
        iVar2 = (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar6);
        Str_01.Data._4_4_ = extraout_var_00;
        Str_01.Data._0_4_ = iVar2;
        Str_01.Length = extraout_RDX;
        raw_ostream::operator<<(prVar3,Str_01);
        (*this->_vptr_generic_parser_base[3])(this,(ulong)uVar6);
        uVar7 = 0;
        uVar6 = 0;
        if (extraout_RDX_00 < 9) {
          uVar6 = 8 - (int)extraout_RDX_00;
        }
        prVar3 = outs();
        prVar3 = raw_ostream::indent(prVar3,uVar6);
        Str_02.Length = 0xb;
        Str_02.Data = " (default: ";
        raw_ostream::operator<<(prVar3,Str_02);
        goto LAB_0014a19c;
      }
      uVar6 = uVar6 + 1;
    } while (uVar1 != uVar6);
  }
  prVar3 = outs();
  pcVar5 = "= *unknown option value*\n";
  sVar4 = 0x19;
  goto LAB_0014a1f1;
  while (uVar6 = (int)uVar7 + 1, uVar7 = (ulong)uVar6, uVar1 != uVar6) {
LAB_0014a19c:
    iVar2 = (*this->_vptr_generic_parser_base[6])(this,uVar7);
    iVar2 = (**Default->_vptr_GenericOptionValue)(Default,CONCAT44(extraout_var_01,iVar2));
    if ((char)iVar2 == '\0') {
      prVar3 = outs();
      iVar2 = (*this->_vptr_generic_parser_base[3])(this,uVar7);
      Str_03.Data._4_4_ = extraout_var_02;
      Str_03.Data._0_4_ = iVar2;
      Str_03.Length = extraout_RDX_01;
      raw_ostream::operator<<(prVar3,Str_03);
      break;
    }
  }
  prVar3 = outs();
  pcVar5 = ")\n";
  sVar4 = 2;
LAB_0014a1f1:
  Str_04.Length = sVar4;
  Str_04.Data = pcVar5;
  raw_ostream::operator<<(prVar3,Str_04);
  return;
}

Assistant:

void generic_parser_base::printGenericOptionDiff(
    const Option &O, const GenericOptionValue &Value,
    const GenericOptionValue &Default, size_t GlobalWidth) const {
  outs() << "  -" << O.ArgStr;
  outs().indent(GlobalWidth - O.ArgStr.size());

  unsigned NumOpts = getNumOptions();
  for (unsigned i = 0; i != NumOpts; ++i) {
    if (Value.compare(getOptionValue(i)))
      continue;

    outs() << "= " << getOption(i);
    size_t L = getOption(i).size();
    size_t NumSpaces = MaxOptWidth > L ? MaxOptWidth - L : 0;
    outs().indent(NumSpaces) << " (default: ";
    for (unsigned j = 0; j != NumOpts; ++j) {
      if (Default.compare(getOptionValue(j)))
        continue;
      outs() << getOption(j);
      break;
    }
    outs() << ")\n";
    return;
  }
  outs() << "= *unknown option value*\n";
}